

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getAutoVacuum(char *z)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long in_FS_OFFSET;
  int x;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    bVar1 = z[lVar4];
    bVar2 = "unix-none"[lVar4 + 5];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar4 = lVar4 + 1;
  } while( true );
  uVar3 = 0;
  if (bVar1 != bVar2) {
    lVar4 = 0;
    do {
      bVar1 = z[lVar4];
      bVar2 = "database or disk is full"[lVar4 + 0x14];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001ac712;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001ac712;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  goto LAB_001ac76f;
LAB_001ac749:
  uVar3 = 2;
  if (bVar1 != bVar2) {
    local_1c = 0;
    sqlite3GetInt32(z,(int *)&local_1c);
    uVar3 = local_1c & 0xff;
    if (2 < local_1c) {
      uVar3 = 0;
    }
  }
  goto LAB_001ac76f;
LAB_001ac712:
  uVar3 = 1;
  if (bVar1 != bVar2) {
    lVar4 = 0;
    do {
      bVar1 = z[lVar4];
      bVar2 = "incremental"[lVar4];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001ac749;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001ac749;
      lVar4 = lVar4 + 1;
    } while( true );
  }
LAB_001ac76f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return uVar3;
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}